

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_24_3_ec8a953c * __thiscall
qclab::qgates::lambda_RotationX<std::complex<float>,float>
          (anon_class_24_3_ec8a953c *__return_storage_ptr__,qgates *this,Op op,float cos,float sin,
          complex<float> *vector)

{
  undefined7 in_register_00000011;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  anon_class_24_3_ec8a953c f;
  complex<float> local_2c;
  complex<float> s;
  float c;
  complex<float> *vector_local;
  float sin_local;
  float cos_local;
  Op op_local;
  
  register0x00000010 = (complex<float> *)CONCAT71(in_register_00000011,op);
  s._M_value._0_4_ = cos;
  std::complex<float>::complex(&local_2c,0.0,-sin);
  if ((char)this == 'C') {
    std::conj<float>(&local_2c);
    local_2c._M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  f.vector._4_4_ = (undefined4)local_2c._M_value;
  f.c = (float)(local_2c._M_value >> 0x20);
  __return_storage_ptr__->vector = stack0xffffffffffffffe0;
  *(ulong *)&__return_storage_ptr__->c = CONCAT44(f.vector._4_4_,(float)s._M_value);
  *(ulong *)((long)&(__return_storage_ptr__->s)._M_value + 4) =
       CONCAT44((undefined4)f.s._M_value,f.c);
  return __return_storage_ptr__;
}

Assistant:

auto lambda_RotationX( Op op , const R cos , const R sin , T* vector ) {
    // operation
    const R c = cos ;
    T s = T( 0 , -sin ) ;
    if ( op == Op::ConjTrans ) s = std::conj( s ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = c * x1 + s * x2 ;
      vector[b] = s * x1 + c * x2 ;
    } ;
    return f ;
  }